

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O0

StringRef __thiscall mp::internal::TextReader<fmt::Locale>::ReadName(TextReader<fmt::Locale> *this)

{
  StringRef SVar1;
  int iVar2;
  TextReader<fmt::Locale> *in_RDI;
  bool bVar3;
  CStringRef unaff_retaddr;
  char *start;
  BasicCStringRef<char> local_28;
  char *local_20;
  char *local_10;
  TextReader<fmt::Locale> *in_stack_fffffffffffffff8;
  
  SkipSpace(in_RDI);
  local_20 = (in_RDI->super_ReaderBase).ptr_;
  if ((*(in_RDI->super_ReaderBase).ptr_ == '\n') || (*(in_RDI->super_ReaderBase).ptr_ == '\0')) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_28,"expected name");
    ReportError<>(in_stack_fffffffffffffff8,unaff_retaddr);
  }
  do {
    (in_RDI->super_ReaderBase).ptr_ = (in_RDI->super_ReaderBase).ptr_ + 1;
    iVar2 = isspace((int)*(in_RDI->super_ReaderBase).ptr_);
    bVar3 = false;
    if (iVar2 == 0) {
      bVar3 = *(in_RDI->super_ReaderBase).ptr_ != '\0';
    }
  } while (bVar3);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)&local_10,local_20,
             (long)(in_RDI->super_ReaderBase).ptr_ - (long)local_20);
  SVar1.size_ = (size_t)in_stack_fffffffffffffff8;
  SVar1.data_ = local_10;
  return SVar1;
}

Assistant:

fmt::StringRef mp::internal::TextReader<Locale>::ReadName() {
  SkipSpace();
  const char *start = ptr_;
  if (*ptr_ == '\n' || !*ptr_)
    ReportError("expected name");
  do ++ptr_;
  while (!std::isspace(*ptr_) && *ptr_);
  return fmt::StringRef(start, ptr_ - start);
}